

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void cs_impl::fiber::destroy(routine_t id)

{
  Routine *this;
  long *plVar1;
  long lVar2;
  int in_EDI;
  value_type_conflict2 local_14;
  
  plVar1 = (long *)ordinator();
  this = *(Routine **)(*plVar1 + (ulong)(in_EDI - 1) * 8);
  if (this != (Routine *)0x0) {
    Routine::~Routine(this);
    operator_delete(this,0x438);
    plVar1 = (long *)ordinator();
    *(undefined8 *)(*plVar1 + (ulong)(in_EDI - 1) * 8) = 0;
    lVar2 = ordinator();
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar2 + 0x18),&local_14);
    return;
  }
  __assert_fail("routine != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x140,"void cs_impl::fiber::destroy(routine_t)");
}

Assistant:

void destroy(routine_t id)
		{
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			delete routine;
			ordinator.routines[id - 1] = nullptr;
			ordinator.indexes.push_back(id);
		}